

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

int util_scan_files(char *dir,char ***result)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  int local_100;
  int j;
  int new_cnt;
  char **subdirs;
  char *fullpath;
  char *name;
  size_t sStack_d8;
  int i;
  size_t capacity;
  size_t size;
  char **filelist;
  dirent **ppdStack_b8;
  int n;
  dirent **files;
  stat stat_buf;
  char ***result_local;
  char *dir_local;
  
  stat_buf.__glibc_reserved[2] = (__syscall_slong_t)result;
  iVar3 = stat(dir,(stat *)&files);
  if (iVar3 == -1) {
    dir_local._4_4_ = -1;
  }
  else if (((uint)stat_buf.st_nlink & 0xf000) == 0x4000) {
    filelist._4_4_ = scandir(dir,&stack0xffffffffffffff48,util_scan_files_comp,alphasort);
    if (filelist._4_4_ < 0) {
      dir_local._4_4_ = -1;
    }
    else {
      size = 0;
      capacity = 0;
      sStack_d8 = 0;
      iVar3 = util_vec_ensure(&size,&stack0xffffffffffffff28,8,8);
      if (iVar3 == 0) {
        for (name._4_4_ = 0; name._4_4_ < filelist._4_4_; name._4_4_ = name._4_4_ + 1) {
          fullpath = ppdStack_b8[name._4_4_]->d_name;
          sVar5 = strlen(dir);
          sVar6 = strlen(fullpath);
          subdirs = (char **)malloc(sVar5 + sVar6 + 3);
          strcpy((char *)subdirs,dir);
          sVar5 = strlen(dir);
          if (dir[sVar5 - 1] != '/') {
            strcat((char *)subdirs,"/");
          }
          strcat((char *)subdirs,fullpath);
          iVar3 = stat((char *)subdirs,(stat *)&files);
          pcVar2 = fullpath;
          if (iVar3 == -1) {
            free(ppdStack_b8[name._4_4_]);
            free(subdirs);
          }
          else if (((uint)stat_buf.st_nlink & 0xf000) == 0x4000) {
            sVar5 = strlen(fullpath);
            if (pcVar2[sVar5 - 1] != '/') {
              strcat((char *)subdirs,"/");
            }
            iVar3 = util_scan_files((char *)subdirs,(char ***)&j);
            for (local_100 = 0; local_100 < iVar3; local_100 = local_100 + 1) {
              sVar5 = strlen(_j[local_100]);
              pvVar7 = malloc(sVar5 + 1);
              *(void **)(size + capacity * 8) = pvVar7;
              lVar1 = capacity * 8;
              capacity = capacity + 1;
              strcpy(*(char **)(size + lVar1),_j[local_100]);
              free(_j[local_100]);
              iVar4 = util_vec_ensure(&size,&stack0xffffffffffffff28,capacity + 1,8);
              if (iVar4 != 0) goto LAB_00109fc7;
            }
            free(_j);
            free(ppdStack_b8[name._4_4_]);
            free(subdirs);
          }
          else {
            *(char ***)(size + capacity * 8) = subdirs;
            sVar8 = capacity + 2;
            capacity = capacity + 1;
            iVar3 = util_vec_ensure(&size,&stack0xffffffffffffff28,sVar8,8);
            if (iVar3 != 0) {
LAB_00109fc7:
              if (size != 0) {
                while (sVar8 = capacity - 1, capacity != 0) {
                  capacity = sVar8;
                  free(*(void **)(size + sVar8 * 8));
                }
                capacity = sVar8;
                free((void *)size);
              }
              return -1;
            }
            free(ppdStack_b8[name._4_4_]);
          }
        }
        *(size_t *)stat_buf.__glibc_reserved[2] = size;
        dir_local._4_4_ = (int)capacity;
      }
      else {
        dir_local._4_4_ = -1;
      }
    }
  }
  else {
    dir_local._4_4_ = -1;
  }
  return dir_local._4_4_;
}

Assistant:

int
util_scan_files(
    const char* dir,
    char*** result)
{
    struct stat stat_buf;
    if (stat(dir, &stat_buf) == -1)
        return -1;
    // We can only scan directories
    if (!S_ISDIR(stat_buf.st_mode))
        return -1;

    struct dirent **files;
    int n;
    n = scandir(dir, &files, util_scan_files_comp, alphasort);
    if (n < 0)
        return -1;

    char** filelist = NULL;
    size_t size = 0, capacity = 0;
    if (util_vec_ensure(&filelist, &capacity, 8, sizeof(char*)))
        return -1;
    for (int i = 0; i < n; ++i) {
        const char* name = files[i]->d_name;
        char* fullpath = malloc(strlen(dir)+strlen(name)+3);
        strcpy(fullpath, dir);
        if (dir[strlen(dir)-1] != '/') strcat(fullpath, "/");
        strcat(fullpath, name);
        if (stat(fullpath, &stat_buf) == -1) {
            free(files[i]);
            free(fullpath);
            continue;
        }
        if (S_ISDIR(stat_buf.st_mode)) {
            char** subdirs;
            if (name[strlen(name)-1] != '/') strcat(fullpath, "/");
            int new_cnt = util_scan_files(fullpath, &subdirs);
            for (int j = 0; j < new_cnt; j++) {
                filelist[size] = malloc(strlen(subdirs[j])+1);
                strcpy(filelist[size++], subdirs[j]);
                free(subdirs[j]);

                if (util_vec_ensure(&filelist, &capacity, size+1, sizeof(char*)))
                    goto err;
            }
            free(subdirs);
            free(files[i]);
            free(fullpath);
            continue;
        }
        filelist[size++] = fullpath;
        if (util_vec_ensure(&filelist, &capacity, size+1, sizeof(char*)))
            goto err;
        free(files[i]);
    }
    *result = filelist;
    return size;
err:
    if (filelist) {
        while (size--)
            free(filelist[size]);
        free(filelist);
    }
    return -1;
}